

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainAppInterface.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  GradeBook gradeBook2;
  GradeBook gradeBook1;
  allocator local_69;
  string local_68;
  string local_48;
  GradeBook local_28;
  
  std::__cxx11::string::string
            ((string *)&local_48,"CS101 Introduction to C++ Programming.",(allocator *)&local_68);
  GradeBook::GradeBook(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"CS102 Data Structures in C++.",&local_69);
  GradeBook::GradeBook((GradeBook *)&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"gradeBook1 created for course: ");
  GradeBook::getCourseName_abi_cxx11_(&local_68,&local_28);
  std::operator<<(poVar1,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"\ngradeBook2 created for course: ");
  GradeBook::getCourseName_abi_cxx11_(&local_68,(GradeBook *)&local_48);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    GradeBook gradeBook1("CS101 Introduction to C++ Programming.");
    GradeBook gradeBook2("CS102 Data Structures in C++.");

    // display initial values of courseName for each GradeBook
    std::cout << "gradeBook1 created for course: "
              << gradeBook1.getCourseName();
    std::cout << "\ngradeBook2 created for course: "
              << gradeBook2.getCourseName() << std::endl;
    return 0;
}